

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

bool __thiscall slang::parsing::Lexer::tryApplyCommentHandler(Lexer *this)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  byte bVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  bool bVar15;
  byte bVar16;
  undefined1 uVar17;
  uint uVar18;
  uint64_t uVar19;
  char *pcVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  char *pcVar24;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  anon_class_8_1_8991fb9c nextWord;
  string_view firstWord;
  string_view local_58 [2];
  
  nextWord.this = this;
  firstWord = tryApplyCommentHandler::anon_class_8_1_8991fb9c::operator()(&nextWord);
  uVar19 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &this->options,&firstWord);
  uVar21 = uVar19 >> ((byte)(this->options).commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar22 = (uVar19 & 0xff) * 4;
  uVar8 = (&UNK_007e24cc)[lVar22];
  uVar9 = (&UNK_007e24cd)[lVar22];
  uVar10 = (&UNK_007e24ce)[lVar22];
  bVar11 = (&UNK_007e24cf)[lVar22];
  uVar23 = 0;
  do {
    pgVar2 = (this->options).commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar21;
    bVar16 = pgVar1->m[0xf].n;
    auVar25[0] = -(pgVar1->m[0].n == uVar8);
    auVar25[1] = -(pgVar1->m[1].n == uVar9);
    auVar25[2] = -(pgVar1->m[2].n == uVar10);
    auVar25[3] = -(pgVar1->m[3].n == bVar11);
    auVar25[4] = -(pgVar1->m[4].n == uVar8);
    auVar25[5] = -(pgVar1->m[5].n == uVar9);
    auVar25[6] = -(pgVar1->m[6].n == uVar10);
    auVar25[7] = -(pgVar1->m[7].n == bVar11);
    auVar25[8] = -(pgVar1->m[8].n == uVar8);
    auVar25[9] = -(pgVar1->m[9].n == uVar9);
    auVar25[10] = -(pgVar1->m[10].n == uVar10);
    auVar25[0xb] = -(pgVar1->m[0xb].n == bVar11);
    auVar25[0xc] = -(pgVar1->m[0xc].n == uVar8);
    auVar25[0xd] = -(pgVar1->m[0xd].n == uVar9);
    auVar25[0xe] = -(pgVar1->m[0xe].n == uVar10);
    auVar25[0xf] = -(bVar16 == bVar11);
    uVar18 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
    if (uVar18 != 0) {
      ppVar3 = (this->options).commentHandlers.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
               .arrays.elements_;
      do {
        iVar6 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        __y = (basic_string_view<char,_std::char_traits<char>_> *)
              ((long)&ppVar3[uVar21 * 0xf].first._M_len + (ulong)(uint)(iVar6 << 6));
        bVar15 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            &this->options,&firstWord,__y);
        if (bVar15) {
          local_58[0] = tryApplyCommentHandler::anon_class_8_1_8991fb9c::operator()(&nextWord);
          uVar19 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              (__y + 1),local_58);
          uVar21 = uVar19 >> ((byte)__y[1]._M_len & 0x3f);
          lVar22 = (uVar19 & 0xff) * 4;
          cVar12 = (&UNK_007e24cc)[lVar22];
          cVar13 = (&UNK_007e24cd)[lVar22];
          cVar14 = (&UNK_007e24ce)[lVar22];
          bVar11 = (&UNK_007e24cf)[lVar22];
          pcVar20 = (char *)0x0;
          do {
            sVar5 = __y[2]._M_len;
            pcVar24 = (char *)(sVar5 + uVar21 * 0x10);
            bVar16 = pcVar24[0xf];
            auVar26[0] = -(*pcVar24 == cVar12);
            auVar26[1] = -(pcVar24[1] == cVar13);
            auVar26[2] = -(pcVar24[2] == cVar14);
            auVar26[3] = -(pcVar24[3] == bVar11);
            auVar26[4] = -(pcVar24[4] == cVar12);
            auVar26[5] = -(pcVar24[5] == cVar13);
            auVar26[6] = -(pcVar24[6] == cVar14);
            auVar26[7] = -(pcVar24[7] == bVar11);
            auVar26[8] = -(pcVar24[8] == cVar12);
            auVar26[9] = -(pcVar24[9] == cVar13);
            auVar26[10] = -(pcVar24[10] == cVar14);
            auVar26[0xb] = -(pcVar24[0xb] == bVar11);
            auVar26[0xc] = -(pcVar24[0xc] == cVar12);
            auVar26[0xd] = -(pcVar24[0xd] == cVar13);
            auVar26[0xe] = -(pcVar24[0xe] == cVar14);
            auVar26[0xf] = -(bVar16 == bVar11);
            uVar18 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
            if (uVar18 != 0) {
              pcVar24 = __y[2]._M_str;
              do {
                uVar7 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                  }
                }
                bVar15 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)(__y + 1),local_58,
                                    (basic_string_view<char,_std::char_traits<char>_> *)
                                    (pcVar24 + (ulong)uVar7 * 0x28 + uVar21 * 600));
                if (bVar15) {
                  uVar17 = (*(code *)(&DAT_008e8f40 +
                                     *(int *)(&DAT_008e8f40 +
                                             (ulong)(uint)((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )(pcVar24 + (ulong)uVar7 * 0x28 + uVar21 * 600))
                                                  [1]._M_len * 4)))();
                  return (bool)uVar17;
                }
                uVar18 = uVar18 - 1 & uVar18;
              } while (uVar18 != 0);
              bVar16 = *(byte *)(sVar5 + uVar21 * 0x10 + 0xf);
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar19 & 7] & bVar16) == 0) {
              return false;
            }
            pcVar24 = pcVar20 + uVar21 + 1;
            pcVar20 = pcVar20 + 1;
            uVar21 = (ulong)pcVar24 & (ulong)__y[1]._M_str;
          } while (pcVar20 <= __y[1]._M_str);
          return false;
        }
        uVar18 = uVar18 - 1 & uVar18;
      } while (uVar18 != 0);
      bVar16 = pgVar2[uVar21].m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar19 & 7] & bVar16) == 0) {
      return false;
    }
    uVar4 = (this->options).commentHandlers.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
            .arrays.groups_size_mask;
    lVar22 = uVar21 + uVar23;
    uVar23 = uVar23 + 1;
    uVar21 = lVar22 + 1U & uVar4;
  } while (uVar23 <= uVar4);
  return false;
}

Assistant:

bool Lexer::tryApplyCommentHandler() {
    auto nextWord = [&]() {
        // Skip over leading spaces and tabs.
        while (isTabOrSpace(peek()))
            advance();

        auto start = sourceBuffer;
        while (true) {
            char c = peek();
            if (!isAlphaNumeric(c) && c != '_' && c != '-')
                break;

            advance();
        }

        return std::string_view(start, size_t(sourceBuffer - start));
    };

    auto firstWord = nextWord();
    auto it = options.commentHandlers.find(firstWord);
    if (it == options.commentHandlers.end()) [[likely]]
        return false;

    auto it2 = it->second.find(nextWord());
    if (it2 == it->second.end())
        return false;

    auto loc = [&] { return SourceLocation(bufferId, currentOffset()); };

    auto& handler = it2->second;
    switch (handler.kind) {
        case CommentHandler::Protect:
            // We need to see begin_protected, otherwise we ignore.
            if (nextWord() == "begin_protected"sv) {
                addDiag(diag::ProtectedEnvelope, currentOffset() - lexemeLength());
                scanDisabledRegion(firstWord, "protect", "end_protected", diag::RawProtectEOF);
                return true;
            }
            return false;
        case CommentHandler::TranslateOff:
            scanDisabledRegion(firstWord, handler.endRegion, std::nullopt,
                               diag::UnclosedTranslateOff);
            return true;
        case CommentHandler::LintOff:
            sourceManager.addDiagnosticDirective(loc(), nextWord(), DiagnosticSeverity::Ignored);
            return false;
        case CommentHandler::LintOn:
            sourceManager.addDiagnosticDirective(loc(), nextWord(), DiagnosticSeverity::Warning);
            return false;
        case CommentHandler::LintSave:
            sourceManager.addDiagnosticDirective(loc(), "__push__", DiagnosticSeverity::Ignored);
            return false;
        case CommentHandler::LintRestore:
            sourceManager.addDiagnosticDirective(loc(), "__pop__", DiagnosticSeverity::Ignored);
            return false;
    }
    SLANG_UNREACHABLE;
}